

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_matcher.hpp
# Opt level: O1

void __thiscall
duckdb::SpecificFunctionMatcher::~SpecificFunctionMatcher(SpecificFunctionMatcher *this)

{
  pointer pcVar1;
  
  (this->super_FunctionMatcher)._vptr_FunctionMatcher =
       (_func_int **)&PTR__SpecificFunctionMatcher_019aa9f8;
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

explicit SpecificFunctionMatcher(string name_p) : name(std::move(name_p)) {
	}